

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall
wasm::WasmBinaryWriter::writeHeapType(WasmBinaryWriter *this,HeapType type,Exactness exactness)

{
  BufferWithRandomAccess *pBVar1;
  BasicHeapType BVar2;
  Shareability SVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined8 in_RCX;
  undefined *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  int __fd;
  Exactness EVar6;
  LEB<long,_signed_char> local_30;
  HeapType local_28;
  HeapType type_local;
  
  uVar4 = (this->wasm->features).features;
  EVar6 = (int)(uVar4 << 10) >> 0x1f & exactness;
  local_28.id = type.id;
  if ((uVar4 >> 10 & 1) == 0) {
    BVar2 = HeapType::getTop(&local_28);
    local_28.id = (uintptr_t)BVar2;
  }
  __n = (undefined *)CONCAT71((int7)((ulong)in_RCX >> 8),EVar6 == Inexact || 0x7c < local_28.id);
  if (EVar6 != Inexact && 0x7c >= local_28.id) {
    __assert_fail("!type.isBasic() || exactness == Inexact",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x699,"void wasm::WasmBinaryWriter::writeHeapType(HeapType, Exactness)");
  }
  if (EVar6 == Exact) {
    local_30.value._0_1_ = 0x62;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               (uchar *)&local_30);
  }
  if (local_28.id < 0x7d) {
    SVar3 = HeapType::getShared(&local_28);
    __buf = extraout_RDX;
    if (SVar3 == Shared) {
      local_30.value._0_1_ = 0x65;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                 (uchar *)&local_30);
      __buf = extraout_RDX_00;
    }
    if (0x7c < local_28.id) {
      __assert_fail("isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
    }
    uVar4 = (uint)local_28.id & 0x7b;
    uVar4 = uVar4 << 0x1d | uVar4 - 8 >> 3;
    if (uVar4 < 0xf) {
      __n = &DAT_00e30338;
      local_30.value = *(long *)(&DAT_00e30338 + (ulong)uVar4 * 8);
    }
    else {
      local_30.value = 0;
    }
    __fd = (int)this->o;
  }
  else {
    pBVar1 = this->o;
    uVar5 = getTypeIndex(this,local_28);
    local_30.value = (long)uVar5;
    __fd = (int)pBVar1;
    __buf = extraout_RDX_01;
  }
  LEB<long,_signed_char>::write(&local_30,__fd,__buf,(size_t)__n);
  return;
}

Assistant:

void WasmBinaryWriter::writeHeapType(HeapType type, Exactness exactness) {
  // ref.null always has a bottom heap type in Binaryen IR, but those types are
  // only actually valid with GC. Otherwise, emit the corresponding valid top
  // types instead.
  if (!wasm->features.hasCustomDescriptors()) {
    exactness = Inexact;
  }
  if (!wasm->features.hasGC()) {
    type = type.getTop();
  }
  assert(!type.isBasic() || exactness == Inexact);
  if (exactness == Exact) {
    o << uint8_t(BinaryConsts::EncodedType::Exact);
  }
  if (!type.isBasic()) {
    o << S64LEB(getTypeIndex(type)); // TODO: Actually s33
    return;
  }

  int ret = 0;
  if (type.isShared()) {
    o << uint8_t(BinaryConsts::EncodedType::Shared);
  }
  switch (type.getBasic(Unshared)) {
    case HeapType::ext:
      ret = BinaryConsts::EncodedHeapType::ext;
      break;
    case HeapType::func:
      ret = BinaryConsts::EncodedHeapType::func;
      break;
    case HeapType::cont:
      ret = BinaryConsts::EncodedHeapType::cont;
      break;
    case HeapType::any:
      ret = BinaryConsts::EncodedHeapType::any;
      break;
    case HeapType::eq:
      ret = BinaryConsts::EncodedHeapType::eq;
      break;
    case HeapType::i31:
      ret = BinaryConsts::EncodedHeapType::i31;
      break;
    case HeapType::struct_:
      ret = BinaryConsts::EncodedHeapType::struct_;
      break;
    case HeapType::array:
      ret = BinaryConsts::EncodedHeapType::array;
      break;
    case HeapType::exn:
      ret = BinaryConsts::EncodedHeapType::exn;
      break;
    case HeapType::string:
      ret = BinaryConsts::EncodedHeapType::string;
      break;
    case HeapType::none:
      ret = BinaryConsts::EncodedHeapType::none;
      break;
    case HeapType::noext:
      ret = BinaryConsts::EncodedHeapType::noext;
      break;
    case HeapType::nofunc:
      ret = BinaryConsts::EncodedHeapType::nofunc;
      break;
    case HeapType::noexn:
      ret = BinaryConsts::EncodedHeapType::noexn;
      break;
    case HeapType::nocont:
      ret = BinaryConsts::EncodedHeapType::nocont;
      break;
  }
  o << S64LEB(ret); // TODO: Actually s33
}